

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O0

string * ToString<unsigned_short>
                   (string *__return_storage_ptr__,
                   basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                   *buf)

{
  utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __result;
  const_iterator p;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __return_storage_ptr___00;
  utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__last;
  undefined8 in_stack_ffffffffffffff58;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  utf16iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  local_48;
  unsigned_short *local_40;
  utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  undefined1 local_19;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  *local_18;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  *buf_local;
  string *str;
  
  local_19 = 0;
  local_18 = buf;
  buf_local = (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
               *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  size(local_18);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_40 = (unsigned_short *)
             std::__cxx11::
             basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
             ::begin(local_18);
  utfadaptor<16>::
  adapt<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>
            ((utfadaptor<16> *)&local_38,
             (__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
              )local_40);
  p = std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::end(local_18);
  utfadaptor<16>::
  adapt<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>
            ((utfadaptor<16> *)&local_48,
             (__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
              )p._M_current);
  __return_storage_ptr___00 = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  __last = utf8_backinserter<std::back_insert_iterator<std::__cxx11::string>>
                     ((utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)__return_storage_ptr___00.container,
                      (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )p._M_current);
  __result._p.container = in_stack_ffffffffffffff60.container;
  __result._0_8_ = in_stack_ffffffffffffff58;
  std::
  copy<utf16iterator<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>,utf8insert_iterator<std::back_insert_iterator<std::__cxx11::string>>>
            (&local_38,&local_48,
             (utf16iterator<__gnu_cxx::__normal_iterator<const_unsigned_short_*,_std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
              *)__last,__result);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(const std::basic_string<T>& buf)
{
    std::string str;
    str.reserve(buf.size());
    std::copy(utfadaptor<sizeof(T)*8>::adapt(buf.begin()), utfadaptor<sizeof(T)*8>::adapt(buf.end()),
          utf8_backinserter(back_inserter(str)));
    return str;
}